

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.cc
# Opt level: O3

void __thiscall Decoder::start(Decoder *this)

{
  long *local_20;
  thread local_18;
  
  local_18._M_id._M_thread = (id)0;
  local_20 = (long *)operator_new(0x10);
  *local_20 = (long)&PTR___State_00185040;
  local_20[1] = (long)this;
  std::thread::_M_start_thread(&local_18,&local_20,0);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  if ((this->thread_)._M_id._M_thread == 0) {
    (this->thread_)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    pthread_setname_np((pthread_t)local_18._M_id._M_thread,"decoder");
    return;
  }
  std::terminate();
}

Assistant:

void Decoder::start() {
  thread_ = std::thread([&] {
      std::array<uint8_t, 892> buf;
      decoder::Packetizer::Details details;
      while (packetizer_->nextPacket(buf, &details)) {
        if (details.ok && packetPublisher_) {
          packetPublisher_->publish(buf);
        }
        publishStats(details);
      }
    });
#ifdef __APPLE__
  pthread_setname_np("decoder");
#else
  pthread_setname_np(thread_.native_handle(), "decoder");
#endif
}